

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlHashSize(void)

{
  int iVar1;
  int iVar2;
  xmlHashTablePtr val;
  int local_24;
  int n_hash;
  xmlHashTablePtr hash;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
    iVar1 = xmlMemBlocks();
    val = gen_xmlHashTablePtr(local_24,0);
    iVar2 = xmlHashSize(val);
    desret_int(iVar2);
    call_tests = call_tests + 1;
    des_xmlHashTablePtr(local_24,val,0);
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlHashSize",(ulong)(uint)(iVar2 - iVar1));
      ret_val = ret_val + 1;
      printf(" %d");
      printf("\n");
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlHashSize(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlHashTablePtr hash; /* hash table */
    int n_hash;

    for (n_hash = 0;n_hash < gen_nb_xmlHashTablePtr;n_hash++) {
        mem_base = xmlMemBlocks();
        hash = gen_xmlHashTablePtr(n_hash, 0);

        ret_val = xmlHashSize(hash);
        desret_int(ret_val);
        call_tests++;
        des_xmlHashTablePtr(n_hash, hash, 0);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlHashSize",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_hash);
            printf("\n");
        }
    }
    function_tests++;

    return(test_ret);
}